

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::x86::RACFGBuilder::onBeforeInvoke(RACFGBuilder *this,InvokeNode *invokeNode)

{
  uint32_t *puVar1;
  FuncValue *arg;
  undefined8 *puVar2;
  OperandPack *pOVar3;
  BaseRAPass *pBVar4;
  BaseBuilder *pBVar5;
  VirtReg *vReg;
  FuncNode *pFVar6;
  Error EVar7;
  uint uVar8;
  undefined8 extraout_RAX;
  char cVar9;
  uint uVar10;
  uint uVar11;
  Operand_ *imm_;
  long lVar12;
  uint32_t uVar13;
  InvokeNode *pIVar14;
  BaseCompiler *this_00;
  long lVar15;
  long lVar16;
  FuncValuePack *pFVar17;
  bool bVar18;
  Reg dst;
  RAWorkReg *workReg;
  RAWorkReg *workReg_1;
  Operand_ local_78;
  InvokeNode *local_68;
  uint local_5c;
  Operand_ local_58;
  RAWorkReg *local_40;
  InvokeNode *local_38;
  
  local_38 = (InvokeNode *)(ulong)(invokeNode->_funcDetail)._argCount;
  this_00 = (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc;
  uVar8 = (this_00->super_BaseBuilder).super_BaseEmitter._gpRegInfo._signature;
  (this_00->super_BaseBuilder)._cursor =
       (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
  if (local_38 != (InvokeNode *)0x0) {
    local_5c = uVar8 >> 3 & 0x1f;
    pFVar17 = (invokeNode->_funcDetail)._args;
    lVar12 = 0;
    pIVar14 = (InvokeNode *)0x0;
    do {
      if (pIVar14 == (InvokeNode *)0x10) {
LAB_00131434:
        onBeforeInvoke();
        goto LAB_00131439;
      }
      lVar16 = 0;
      lVar15 = lVar12;
      local_68 = pIVar14;
      do {
        uVar8 = *(uint *)((long)&pFVar17->_values[0]._data + lVar16);
        if (uVar8 == 0) break;
        if ((invokeNode->_funcDetail)._argCount <= (byte)pIVar14) {
          onBeforeInvoke();
          return 0x1f;
        }
        pOVar3 = invokeNode->_args;
        uVar10 = *(uint *)((long)pOVar3->_data[0]._data + lVar16 * 4 + lVar12 + -8);
        if (uVar10 != 0) {
          arg = (FuncValue *)((long)&pFVar17->_values[0]._data + lVar16);
          imm_ = (Operand_ *)((long)pOVar3->_data[0]._data + lVar15 + -8);
          uVar10 = uVar10 & 7;
          if (uVar10 == 3) {
            if ((uVar8 >> 8 & 1) == 0) {
              EVar7 = moveImmToStackArg(this,pIVar14,arg,(Imm *)imm_);
joined_r0x00130f74:
              pIVar14 = local_68;
              if (EVar7 != 0) {
                return EVar7;
              }
            }
            else {
              local_78._signature = 1;
              local_78._baseId = 0xff;
              local_78._data[0] = 0;
              local_78._data[1] = 0;
              EVar7 = moveImmToRegArg(this,pIVar14,arg,(Imm *)imm_,(BaseReg *)&local_78);
              if (EVar7 != 0) {
                return EVar7;
              }
              puVar2 = (undefined8 *)
                       ((long)invokeNode->_args->_data[0]._data + lVar16 * 4 + lVar12 + -8);
              *puVar2 = CONCAT44(local_78._baseId,local_78._signature);
              puVar2[1] = CONCAT44(local_78._data[1],local_78._data[0]);
              pIVar14 = local_68;
            }
          }
          else if (uVar10 == 1) {
            pBVar4 = (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass;
            uVar11 = *(int *)((long)pOVar3->_data[0]._data + lVar16 * 4 + lVar12 + -4) - 0x100;
            pBVar5 = (pBVar4->super_FuncPass).super_Pass._cb;
            uVar10._0_1_ = pBVar5[1].super_BaseEmitter._environment._arch;
            uVar10._1_1_ = pBVar5[1].super_BaseEmitter._environment._subArch;
            uVar10._2_1_ = pBVar5[1].super_BaseEmitter._environment._vendor;
            uVar10._3_1_ = pBVar5[1].super_BaseEmitter._environment._platform;
            if (uVar10 <= uVar11) {
              return 0x1f;
            }
            pIVar14 = (InvokeNode *)
                      pBVar5[1].super_BaseEmitter._errorHandler[uVar11]._vptr_ErrorHandler;
            local_58._0_8_ = (pIVar14->super_InstNode).super_BaseNode._passData;
            if ((RAWorkReg *)local_58._0_8_ == (RAWorkReg *)0x0) {
              EVar7 = BaseRAPass::_asWorkReg(pBVar4,(VirtReg *)pIVar14,(RAWorkReg **)&local_58);
              if (EVar7 != 0) {
                return EVar7;
              }
              uVar8 = arg->_data;
            }
            if ((uVar8 >> 8 & 1) == 0) {
              if ((uVar8 >> 10 & 1) != 0) {
                uVar8 = *(uint *)((long)pOVar3->_data[0]._data + lVar16 * 4 + lVar12 + -8);
                if ((uVar8 & 0xf00) == 0) {
                  if ((uVar8 >> 3 & 0x1f) != local_5c) {
                    return 0x1a;
                  }
                  EVar7 = moveRegToStackArg(this,pIVar14,arg,(BaseReg *)imm_);
                  pIVar14 = local_68;
                  if (EVar7 != 0) {
                    return EVar7;
                  }
                  goto LAB_0013110d;
                }
                local_78._signature = 1;
                local_78._baseId = 0xff;
                local_78._data[0] = 0;
                local_78._data[1] = 0;
                pIVar14 = invokeNode;
                moveVecToPtr(this,invokeNode,arg,(Vec *)imm_,(BaseReg *)&local_78);
                imm_ = &local_78;
              }
              EVar7 = moveRegToStackArg(this,pIVar14,arg,(BaseReg *)imm_);
              goto joined_r0x00130f74;
            }
            if (0x1fffffff < uVar8) {
              onBeforeInvoke();
              goto LAB_00131434;
            }
            if ((uVar8 >> 10 & 1) == 0) {
              bVar18 = ((((RegInfo *)(local_58._0_8_ + 0x20))->_signature ^
                        *(uint *)(_archTraits + (ulong)(uVar8 >> 0x18) * 4 + 0xe8)) & 0xf00) == 0;
            }
            else {
              uVar8 = *(uint *)((long)pOVar3->_data[0]._data + lVar16 * 4 + lVar12 + -8);
              if ((uVar8 & 0xf00) != 0) {
                local_78._signature = 1;
                local_78._baseId = 0xff;
                local_78._data[0] = 0;
                local_78._data[1] = 0;
                moveVecToPtr(this,invokeNode,arg,(Vec *)imm_,(BaseReg *)&local_78);
                puVar2 = (undefined8 *)
                         ((long)invokeNode->_args->_data[0]._data + lVar16 * 4 + lVar12 + -8);
                *puVar2 = CONCAT44(local_78._baseId,local_78._signature);
                puVar2[1] = CONCAT44(local_78._data[1],local_78._data[0]);
                pIVar14 = local_68;
                goto LAB_0013110d;
              }
              bVar18 = (uVar8 >> 3 & 0x1f) == local_5c;
            }
            pIVar14 = local_68;
            if (!bVar18) {
              return 0x1a;
            }
          }
        }
LAB_0013110d:
        lVar16 = lVar16 + 4;
        lVar15 = lVar15 + 0x10;
      } while (lVar16 != 0x10);
      pIVar14 = (InvokeNode *)((long)(pIVar14->super_InstNode).super_BaseNode.field_0._links + 1);
      pFVar17 = pFVar17 + 1;
      lVar12 = lVar12 + 0x40;
    } while (pIVar14 != local_38);
    this_00 = (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc;
  }
  (this_00->super_BaseBuilder)._cursor = (BaseNode *)invokeNode;
  if (((invokeNode->_funcDetail)._callConv._flags & 1) != 0) {
    local_78._signature = (this_00->super_BaseBuilder).super_BaseEmitter._gpRegInfo._signature;
    local_78._baseId = 4;
    local_78._data[0] = 0;
    local_78._data[1] = 0;
    local_58._0_8_ = (RAWorkReg *)0x3;
    local_58._data[1] = 0;
    local_58._data[0] = (invokeNode->_funcDetail)._argStackSize;
    EVar7 = BaseEmitter::_emitI((BaseEmitter *)this_00,0x2f6,&local_78,&local_58);
    if (EVar7 != 0) {
      return EVar7;
    }
  }
  if ((invokeNode->_funcDetail)._rets._values[0]._data != 0) {
    lVar12 = 0;
    do {
      uVar8 = *(uint *)((long)&(invokeNode->_funcDetail)._rets._values[0]._data + lVar12);
      if (uVar8 == 0) break;
      if (((invokeNode->_rets)._data[0]._data[lVar12 + -2] & 7) == 1) {
        pBVar4 = (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass;
        uVar10 = (invokeNode->_rets)._data[0]._data[lVar12 + -1] - 0x100;
        pBVar5 = (pBVar4->super_FuncPass).super_Pass._cb;
        uVar11._0_1_ = pBVar5[1].super_BaseEmitter._environment._arch;
        uVar11._1_1_ = pBVar5[1].super_BaseEmitter._environment._subArch;
        uVar11._2_1_ = pBVar5[1].super_BaseEmitter._environment._vendor;
        uVar11._3_1_ = pBVar5[1].super_BaseEmitter._environment._platform;
        if (uVar11 <= uVar10) {
          return 0x1f;
        }
        vReg = (VirtReg *)pBVar5[1].super_BaseEmitter._errorHandler[uVar10]._vptr_ErrorHandler;
        local_40 = vReg->_workReg;
        if (local_40 == (RAWorkReg *)0x0) {
          EVar7 = BaseRAPass::_asWorkReg(pBVar4,vReg,&local_40);
          if (EVar7 != 0) {
            return EVar7;
          }
          uVar8 = *(uint *)((long)&(invokeNode->_funcDetail)._rets._values[0]._data + lVar12);
        }
        if ((uVar8 >> 8 & 1) != 0) {
          if (uVar8 >> 0x18 == 0x15) {
            local_78._signature = (local_40->_info)._signature;
            if ((local_78._signature & 0xf00) != 0x100) {
              return 0x1a;
            }
            local_78._baseId = local_40->_virtId;
            local_78._data[0] = 0;
            local_78._data[1] = 0;
            local_58._0_8_ = (RAWorkReg *)0x2;
            local_58._data[0] = 0;
            local_58._data[1] = 0;
            cVar9 = Type::_typeData[local_40->_virtReg->_typeId];
            if ((char)uVar8 != '\0') {
              cVar9 = (char)uVar8;
            }
            if (cVar9 == '+') {
              EVar7 = BaseRAPass::useTemporaryMem
                                ((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                 (BaseMem *)&local_58,8,4);
              if (EVar7 != 0) {
                return EVar7;
              }
              local_58._signature._3_1_ = 8;
              EVar7 = BaseEmitter::_emitI((BaseEmitter *)
                                          (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc
                                          ,0xef,&local_58);
              if (EVar7 != 0) {
                return EVar7;
              }
              uVar13 = 0x1c1;
              if (this->_avxEnabled != false) {
                uVar13 = 0x443;
              }
              EVar7 = BaseEmitter::_emitI((BaseEmitter *)
                                          (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc
                                          ,uVar13,&local_78,&local_58);
            }
            else {
              if (cVar9 != '*') {
                return 0x1a;
              }
              EVar7 = BaseRAPass::useTemporaryMem
                                ((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                 (BaseMem *)&local_58,4,4);
              if (EVar7 != 0) {
                return EVar7;
              }
              local_58._signature._3_1_ = 4;
              EVar7 = BaseEmitter::_emitI((BaseEmitter *)
                                          (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc
                                          ,0xef,&local_58);
              if (EVar7 != 0) {
                return EVar7;
              }
              uVar13 = 0x1c4;
              if (this->_avxEnabled != false) {
                uVar13 = 0x446;
              }
              EVar7 = BaseEmitter::_emitI((BaseEmitter *)
                                          (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc
                                          ,uVar13,&local_78,&local_58);
            }
            if (EVar7 != 0) {
              return EVar7;
            }
          }
          else {
            if (0x1fffffff < uVar8) {
LAB_00131439:
              onBeforeInvoke();
              __clang_call_terminate(extraout_RAX);
            }
            if (((*(uint *)(_archTraits + (ulong)(uVar8 >> 0x18) * 4 + 0xe8) ^
                 (local_40->_info)._signature) & 0xf00) != 0) {
              return 0x1a;
            }
          }
        }
      }
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x10);
  }
  puVar1 = &((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock)->_flags;
  *puVar1 = *puVar1 | 0x1000;
  pFVar6 = ((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass)->_func;
  (pFVar6->_frame)._attributes = (pFVar6->_frame)._attributes | 0x20;
  uVar8 = (invokeNode->_funcDetail)._argStackSize;
  uVar10 = (pFVar6->_frame)._callStackSize;
  if (uVar8 < uVar10) {
    uVar8 = uVar10;
  }
  (pFVar6->_frame)._callStackSize = uVar8;
  return 0;
}

Assistant:

Error RACFGBuilder::onBeforeInvoke(InvokeNode* invokeNode) noexcept {
  const FuncDetail& fd = invokeNode->detail();
  uint32_t argCount = invokeNode->argCount();

  cc()->_setCursor(invokeNode->prev());
  uint32_t nativeRegType = cc()->_gpRegInfo.type();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        break;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isReg()) {
          uint32_t regGroup = workReg->group();
          uint32_t argGroup = Reg::groupOf(arg.regType());

          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);
              // It's considered allocated if this is an indirect argument and the user used GP.
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            invokeNode->_args[argIndex][valueIndex] = indirectReg;
          }
          else {
            if (regGroup != argGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
        else {
          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);

              ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, indirectReg));
          }
          else {
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
          }
        }
      }
      else if (op.isImm()) {
        if (arg.isReg()) {
          BaseReg reg;
          ASMJIT_PROPAGATE(moveImmToRegArg(invokeNode, arg, op.as<Imm>(), &reg));
          invokeNode->_args[argIndex][valueIndex] = reg;
        }
        else {
          ASMJIT_PROPAGATE(moveImmToStackArg(invokeNode, arg, op.as<Imm>()));
        }
      }
    }
  }

  cc()->_setCursor(invokeNode);
  if (fd.hasFlag(CallConv::kFlagCalleePopsStack))
    ASMJIT_PROPAGATE(cc()->sub(cc()->zsp(), fd.argStackSize()));

  if (fd.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      const FuncValue& ret = fd.ret(valueIndex);
      if (!ret)
        break;

      const Operand& op = invokeNode->ret(valueIndex);
      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (ret.isReg()) {
          if (ret.regType() == Reg::kTypeSt) {
            if (workReg->group() != Reg::kGroupVec)
              return DebugUtils::errored(kErrorInvalidAssignment);

            Reg dst = Reg::fromSignatureAndId(workReg->signature(), workReg->virtId());
            Mem mem;

            uint32_t typeId = Type::baseOf(workReg->typeId());
            if (ret.hasTypeId())
              typeId = ret.typeId();

            switch (typeId) {
              case Type::kIdF32:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 4, 4));
                mem.setSize(4);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), dst.as<Xmm>(), mem));
                break;

              case Type::kIdF64:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 8, 4));
                mem.setSize(8);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovsd, Inst::kIdVmovsd), dst.as<Xmm>(), mem));
                break;

              default:
                return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
          else {
            uint32_t regGroup = workReg->group();
            uint32_t retGroup = Reg::groupOf(ret.regType());

            if (regGroup != retGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
      }
    }
  }

  // This block has function call(s).
  _curBlock->addFlags(RABlock::kFlagHasFuncCalls);
  _pass->func()->frame().addAttributes(FuncFrame::kAttrHasFuncCalls);
  _pass->func()->frame().updateCallStackSize(fd.argStackSize());

  return kErrorOk;
}